

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::computeBuiltinPrecisions
          (TParseContext *this,TIntermTyped *node,TFunction *function)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar3;
  long *plVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar5;
  long lVar6;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long *plVar2;
  
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[4])(node);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    return;
  }
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[7])(node);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar1);
  if (plVar4 == (long *)0x0) {
    iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[6])(node);
    plVar4 = (long *)CONCAT44(extraout_var_05,iVar1);
    if (plVar4 == (long *)0x0) {
      uVar8 = 0;
    }
    else {
      lVar3 = (**(code **)(*plVar4 + 400))(plVar4);
      iVar1 = (int)plVar4[0x17];
      if (iVar1 - 0xa2U < 3) {
LAB_0039d143:
        uVar9 = 1;
      }
      else if ((iVar1 - 0x14eU < 0x17) && ((0x400003U >> (iVar1 - 0x14eU & 0x1f) & 1) != 0)) {
        uVar9 = 0;
      }
      else if (iVar1 == 0x249) {
        uVar9 = 2;
      }
      else {
        if (iVar1 == 0x248) goto LAB_0039d143;
        uVar9 = (uint)((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) >> 3);
      }
      uVar8 = 0;
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        plVar5 = (long *)(**(code **)(**(long **)(*(long *)(lVar3 + 8) + uVar10 * 8) + 0x18))();
        lVar6 = (**(code **)(*plVar5 + 0x108))(plVar5);
        uVar7 = *(uint *)(lVar6 + 8) >> 0x19 & 7;
        if (uVar7 < uVar8) {
          uVar7 = uVar8;
        }
        iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar10 & 0xffffffff);
        lVar6 = (**(code **)(**(long **)(CONCAT44(extraout_var_06,iVar1) + 8) + 0x50))();
        uVar8 = *(uint *)(lVar6 + 8) >> 0x19 & 7;
        if (uVar8 < uVar7) {
          uVar8 = uVar7;
        }
      }
      if ((int)plVar4[0x17] - 0x1f2U < 4 || (int)plVar4[0x17] - 0x20cU < 0x36) {
        plVar4 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar3 + 8) + 0x18))();
        lVar3 = (**(code **)(*plVar4 + 0x108))(plVar4);
        uVar9 = *(uint *)(lVar3 + 8) >> 0x19 & 7;
        goto LAB_0039d21c;
      }
      iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar1) + 0x38))
                        ((long *)CONCAT44(extraout_var_07,iVar1));
      if (iVar1 != 0xc) goto LAB_0039d07e;
    }
    uVar9 = 0;
  }
  else {
    iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,0);
    lVar3 = (**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar1) + 8) + 0x50))();
    uVar9 = *(uint *)(lVar3 + 8) >> 0x19 & 7;
    plVar4 = (long *)(**(code **)(*plVar4 + 0x188))(plVar4);
    plVar4 = (long *)(**(code **)(*plVar4 + 0xf0))(plVar4);
    lVar3 = (**(code **)(*plVar4 + 0x58))(plVar4);
    uVar8 = *(uint *)(lVar3 + 8) >> 0x19 & 7;
    if (uVar8 < uVar9) {
      uVar8 = uVar9;
    }
    iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
    iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x38))
                      ((long *)CONCAT44(extraout_var_02,iVar1));
    uVar9 = 0;
    if (iVar1 == 0xc) goto LAB_0039d21c;
LAB_0039d07e:
    iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x58))
                      ((long *)CONCAT44(extraout_var_03,iVar1));
    uVar9 = uVar8;
    if ((*(byte *)(lVar3 + 0xb) & 0xe) != 0) {
      iVar1 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x58))
                        ((long *)CONCAT44(extraout_var_04,iVar1));
      uVar9 = *(uint *)(lVar3 + 8) >> 0x19 & 7;
    }
  }
LAB_0039d21c:
  lVar3 = (**(code **)(*plVar2 + 0x108))(plVar2);
  *(byte *)(lVar3 + 0xb) = *(byte *)(lVar3 + 0xb) & 0xf1;
  if (uVar8 != 0) {
    (**(code **)(*plVar2 + 0x128))(plVar2,uVar8);
    *(uint *)((long)plVar2 + 0xbc) = uVar8;
  }
  lVar3 = (**(code **)(*plVar2 + 0x108))(plVar2);
  *(ulong *)(lVar3 + 8) = *(ulong *)(lVar3 + 8) & 0xfffffffff1ffffff | (ulong)(uVar9 << 0x19);
  return;
}

Assistant:

void TParseContext::computeBuiltinPrecisions(TIntermTyped& node, const TFunction& function)
{
    TPrecisionQualifier operationPrecision = EpqNone;
    TPrecisionQualifier resultPrecision = EpqNone;

    TIntermOperator* opNode = node.getAsOperator();
    if (opNode == nullptr)
        return;

    if (TIntermUnary* unaryNode = node.getAsUnaryNode()) {
        operationPrecision = std::max(function[0].type->getQualifier().precision,
                                      unaryNode->getOperand()->getType().getQualifier().precision);
        if (function.getType().getBasicType() != EbtBool)
            resultPrecision = function.getType().getQualifier().precision == EpqNone ?
                                        operationPrecision :
                                        function.getType().getQualifier().precision;
    } else if (TIntermAggregate* agg = node.getAsAggregate()) {
        TIntermSequence& sequence = agg->getSequence();
        unsigned int numArgs = (unsigned int)sequence.size();
        switch (agg->getOp()) {
        case EOpBitfieldExtract:
            numArgs = 1;
            break;
        case EOpBitfieldInsert:
            numArgs = 2;
            break;
        case EOpInterpolateAtCentroid:
        case EOpInterpolateAtOffset:
        case EOpInterpolateAtSample:
            numArgs = 1;
            break;
        case EOpDebugPrintf:
        case EOpCooperativeMatrixPerElementOpNV:
        case EOpCooperativeMatrixReduceNV:
            numArgs = 0;
            break;
        default:
            break;
        }
        // find the maximum precision from the arguments and parameters
        for (unsigned int arg = 0; arg < numArgs; ++arg) {
            operationPrecision = std::max(operationPrecision, sequence[arg]->getAsTyped()->getQualifier().precision);
            operationPrecision = std::max(operationPrecision, function[arg].type->getQualifier().precision);
        }
        // compute the result precision
        if (agg->isSampling() ||
            agg->getOp() == EOpImageLoad || agg->getOp() == EOpImageStore ||
            agg->getOp() == EOpImageLoadLod || agg->getOp() == EOpImageStoreLod)
            resultPrecision = sequence[0]->getAsTyped()->getQualifier().precision;
        else if (function.getType().getBasicType() != EbtBool)
            resultPrecision = function.getType().getQualifier().precision == EpqNone ?
                                        operationPrecision :
                                        function.getType().getQualifier().precision;
    }

    // Propagate precision through this node and its children. That algorithm stops
    // when a precision is found, so start by clearing this subroot precision
    opNode->getQualifier().precision = EpqNone;
    if (operationPrecision != EpqNone) {
        opNode->propagatePrecision(operationPrecision);
        opNode->setOperationPrecision(operationPrecision);
    }
    // Now, set the result precision, which might not match
    opNode->getQualifier().precision = resultPrecision;
}